

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::Module::removeTables(Module *this,function<bool_(wasm::Table_*)> *pred)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<bool_(wasm::Table_*)>::function((function<bool_(wasm::Table_*)> *)&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>
            (&this->tables,&this->tablesMap,(function<bool_(wasm::Table_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void Module::removeTables(std::function<bool(Table*)> pred) {
  removeModuleElements(tables, tablesMap, pred);
}